

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline.c
# Opt level: O2

symbol_list * copy_symbol_list(dmr_C *C,symbol_list *src)

{
  symbol *psVar1;
  undefined1 local_48 [8];
  ptr_list_iter symiter__;
  symbol_list *dst;
  
  symiter__.__nr = 0;
  symiter__._20_4_ = 0;
  ptrlist_forward_iterator((ptr_list_iter *)local_48,(ptr_list *)src);
  psVar1 = (symbol *)ptrlist_iter_next((ptr_list_iter *)local_48);
  while (psVar1 != (symbol *)0x0) {
    psVar1 = copy_symbol(C,psVar1->pos,psVar1);
    ptrlist_add((ptr_list **)&symiter__.__nr,psVar1,&C->ptrlist_allocator);
    psVar1 = (symbol *)ptrlist_iter_next((ptr_list_iter *)local_48);
  }
  return (symbol_list *)symiter__._16_8_;
}

Assistant:

static struct symbol_list *copy_symbol_list(struct dmr_C *C, struct symbol_list *src)
{
	struct symbol_list *dst = NULL;
	struct symbol *sym;

	FOR_EACH_PTR(src, sym) {
		struct symbol *newsym = copy_symbol(C, sym->pos, sym);
		dmrC_add_symbol(C, &dst, newsym);
	} END_FOR_EACH_PTR(sym);
	return dst;
}